

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaction.cpp
# Opt level: O0

void __thiscall IO::Reaction::Reaction(Reaction *this)

{
  Reaction *this_local;
  
  this->flagReversible_ = true;
  this->flagHasREV_ = false;
  this->flagDuplicate_ = false;
  memset(&this->reactants_,0,0x30);
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::multimap(&this->reactants_);
  memset(&this->products_,0,0x30);
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::multimap(&this->products_);
  memset(&this->forwardArrhenius_,0,0x18);
  memset(&this->reverseArrhenius_,0,0x18);
  this->flagThirdBody_ = false;
  this->flagLOW_ = false;
  this->flagTROE_ = false;
  this->flagSRI_ = false;
  this->flagPressureDependent_ = false;
  memset(&this->thirdBodies_,0,0x30);
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::multimap(&this->thirdBodies_);
  std::__cxx11::string::string((string *)&this->fallOffBody_);
  std::vector<double,_std::allocator<double>_>::vector(&this->LOW_);
  std::vector<double,_std::allocator<double>_>::vector(&this->TROE_);
  std::vector<double,_std::allocator<double>_>::vector(&this->SRI_);
  return;
}

Assistant:

IO::Reaction::Reaction()
:flagReversible_(true)
,flagDuplicate_(false)
,reactants_()
,products_()
,forwardArrhenius_()
,reverseArrhenius_()
,flagHasREV_(false)
,flagThirdBody_(false)
,flagLOW_(false)
,flagTROE_(false)
,flagSRI_(false)
,flagPressureDependent_(false)
,thirdBodies_()
,fallOffBody_()
{}